

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O2

void __kmp_api_omp_set_default_device(int arg)

{
  kmp_info_t *pkVar1;
  
  pkVar1 = __kmp_entry_thread();
  (((pkVar1->th).th_current_task)->td_icvs).default_device = arg;
  return;
}

Assistant:

void FTN_STDCALL KMP_EXPAND_NAME(FTN_SET_DEFAULT_DEVICE)(int KMP_DEREF arg) {
#if KMP_MIC || KMP_OS_DARWIN || defined(KMP_STUB)
// Nothing.
#else
  __kmp_entry_thread()->th.th_current_task->td_icvs.default_device =
      KMP_DEREF arg;
#endif
}